

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O3

void __thiscall TcpSocketTest::handleAccept(TcpSocketTest *this)

{
  SocketListener *in_RSI;
  
  JetHead::Socket::setSelector(in_RSI,(Selector *)this);
  return;
}

Assistant:

bool TcpSocketTest::handleAccept( Socket *s ) 
{
  //cerr << "accept" <<endl;
  LOG_NOTICE( "called" );
  // Do this becaue setSelector has different behavior
  // depending on if we are connected or not.
  s->setSelector( this, mSelector );
	return true;
}